

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardEuler.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::integrators::ForwardEuler::evaluateCollocationConstraintJacobian
          (ForwardEuler *this,double time,
          vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
          *collocationPoints,
          vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *controlInputs,
          double dT,
          vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
          *stateJacobianValues,
          vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
          *controlJacobianValues)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  size_type sVar4;
  ostream *poVar5;
  char *pcVar6;
  element_type *peVar7;
  size_t sVar8;
  size_t sVar9;
  ulong uVar10;
  reference pvVar11;
  const_reference pvVar12;
  MatrixDynSize *pMVar13;
  vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_> *in_RCX;
  vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *in_RDX;
  vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *in_RSI;
  long in_RDI;
  vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_> *in_R8;
  undefined8 in_XMM0_Qa;
  uint nu;
  uint nx;
  ostringstream errorMsg_1;
  ostringstream errorMsg;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_fffffffffffffa08;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> *in_stack_fffffffffffffa10;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffa28;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_fffffffffffffa30;
  MatrixDynSize *in_stack_fffffffffffffa38;
  StorageBaseType *in_stack_fffffffffffffa50;
  double *in_stack_fffffffffffffa58;
  string local_380 [32];
  ostringstream local_360 [376];
  string local_1e8 [48];
  ostringstream local_1b8 [376];
  vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_> *local_40;
  vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_> *local_38;
  vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *local_28;
  vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *local_20;
  undefined8 local_18;
  byte local_1;
  
  local_40 = in_R8;
  local_38 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_XMM0_Qa;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x10));
  if (!bVar1) {
    IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x3a8269);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iDynTree::reportError(pcVar3,"evaluateCollocationConstraint","Dynamical system not set.");
    local_1 = 0;
    goto LAB_003a8a87;
  }
  sVar4 = std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::size
                    (local_20);
  if (sVar4 != 2) {
    std::__cxx11::ostringstream::ostringstream(local_1b8);
    std::operator<<((ostream *)local_1b8,
                    "The size of the matrix containing the collocation point does not match the expected one. Input = "
                   );
    sVar4 = std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::size
                      (local_20);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_1b8,sVar4);
    std::operator<<(poVar5,", Expected = 2.");
    IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x3a8315);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    iDynTree::reportError(pcVar3,"evaluateCollocationConstraintJacobian",pcVar6);
    std::__cxx11::string::~string(local_1e8);
    local_1 = 0;
    std::__cxx11::ostringstream::~ostringstream(local_1b8);
    goto LAB_003a8a87;
  }
  sVar4 = std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::size
                    (local_28);
  if (sVar4 != 2) {
    std::__cxx11::ostringstream::ostringstream(local_360);
    std::operator<<((ostream *)local_360,
                    "The size of the matrix containing the control inputs does not match the expected one. Input = "
                   );
    sVar4 = std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::size
                      (local_28);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_360,sVar4);
    std::operator<<(poVar5,", Expected = 2.");
    IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x3a8456);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    iDynTree::reportError(pcVar3,"evaluateCollocationConstraintJacobian",pcVar6);
    std::__cxx11::string::~string(local_380);
    local_1 = 0;
    std::__cxx11::ostringstream::~ostringstream(local_360);
    goto LAB_003a8a87;
  }
  peVar7 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3a8524);
  sVar8 = DynamicalSystem::stateSpaceSize(peVar7);
  peVar7 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3a8541);
  sVar9 = DynamicalSystem::controlSpaceSize(peVar7);
  sVar4 = std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::size
                    (local_38);
  if (sVar4 != 2) {
    std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::resize
              ((vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_> *)
               in_stack_fffffffffffffa30,(size_type)in_stack_fffffffffffffa28);
  }
  std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::operator[]
            (local_38,0);
  uVar10 = iDynTree::MatrixDynSize::rows();
  if (uVar10 == (sVar8 & 0xffffffff)) {
    std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::operator[]
              (local_38,0);
    uVar10 = iDynTree::MatrixDynSize::cols();
    if (uVar10 != (sVar8 & 0xffffffff)) goto LAB_003a85bf;
  }
  else {
LAB_003a85bf:
    pvVar11 = std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::
              operator[](local_38,0);
    iDynTree::MatrixDynSize::resize((ulong)pvVar11,sVar8 & 0xffffffff);
  }
  peVar7 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3a85f8);
  pvVar12 = std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::
            operator[](local_28,0);
  uVar2 = (*peVar7->_vptr_DynamicalSystem[3])(peVar7,pvVar12);
  if ((uVar2 & 1) == 0) {
    IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x3a862e);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iDynTree::reportError
              (pcVar3,"evaluateCollocationConstraintJacobian",
               "Error while setting the control input.");
    local_1 = 0;
    goto LAB_003a8a87;
  }
  peVar7 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3a8667);
  pvVar12 = std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::
            operator[](local_20,0);
  uVar2 = (*peVar7->_vptr_DynamicalSystem[9])(local_18,peVar7,pvVar12,in_RDI + 0x78);
  if ((uVar2 & 1) == 0) {
    IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x3a86af);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iDynTree::reportError
              (pcVar3,"evaluateCollocationConstraintJacobian",
               "Error while evaluating the dynamical system jacobian.");
    local_1 = 0;
    goto LAB_003a8a87;
  }
  toEigen(in_stack_fffffffffffffa38);
  toEigen(in_stack_fffffffffffffa38);
  Eigen::operator*(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::operator+
            ((MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
  std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::operator[]
            (local_38,0);
  toEigen(in_stack_fffffffffffffa38);
  Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>::operator=
            (in_stack_fffffffffffffa10,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
              *)in_stack_fffffffffffffa08);
  std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::operator[]
            (local_38,1);
  uVar10 = iDynTree::MatrixDynSize::rows();
  if (uVar10 == (sVar8 & 0xffffffff)) {
    std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::operator[]
              (local_38,1);
    uVar10 = iDynTree::MatrixDynSize::cols();
    if (uVar10 != (sVar8 & 0xffffffff)) goto LAB_003a87c5;
  }
  else {
LAB_003a87c5:
    pvVar11 = std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::
              operator[](local_38,1);
    iDynTree::MatrixDynSize::resize((ulong)pvVar11,sVar8 & 0xffffffff);
  }
  toEigen(in_stack_fffffffffffffa38);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
  operator-(in_stack_fffffffffffffa28);
  std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::operator[]
            (local_38,1);
  toEigen(in_stack_fffffffffffffa38);
  Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>::operator=
            (in_stack_fffffffffffffa10,
             (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
              *)in_stack_fffffffffffffa08);
  sVar4 = std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::size
                    (local_40);
  if (sVar4 != 2) {
    std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::resize
              ((vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_> *)
               in_stack_fffffffffffffa30,(size_type)in_stack_fffffffffffffa28);
  }
  std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::operator[]
            (local_40,0);
  uVar10 = iDynTree::MatrixDynSize::rows();
  if (uVar10 == (sVar8 & 0xffffffff)) {
    std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::operator[]
              (local_40,0);
    uVar10 = iDynTree::MatrixDynSize::cols();
    if (uVar10 != (sVar9 & 0xffffffff)) goto LAB_003a88c5;
  }
  else {
LAB_003a88c5:
    pvVar11 = std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::
              operator[](local_40,0);
    iDynTree::MatrixDynSize::resize((ulong)pvVar11,sVar8 & 0xffffffff);
  }
  peVar7 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3a88fe);
  pvVar12 = std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::
            operator[](local_20,0);
  uVar2 = (*peVar7->_vptr_DynamicalSystem[10])(local_18,peVar7,pvVar12,in_RDI + 0xa0);
  if ((uVar2 & 1) == 0) {
    IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x3a8949);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iDynTree::reportError
              (pcVar3,"evaluateCollocationConstraintJacobian",
               "Error while evaluating the dynamical system control jacobian.");
    local_1 = 0;
    goto LAB_003a8a87;
  }
  toEigen(in_stack_fffffffffffffa38);
  Eigen::operator*(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
  std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::operator[]
            (local_40,0);
  toEigen(in_stack_fffffffffffffa38);
  Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)peVar7,
             in_stack_fffffffffffffa08);
  std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::operator[]
            (local_40,1);
  uVar10 = iDynTree::MatrixDynSize::rows();
  if (uVar10 == (sVar8 & 0xffffffff)) {
    std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::operator[]
              (local_40,1);
    uVar10 = iDynTree::MatrixDynSize::cols();
    if (uVar10 != (sVar9 & 0xffffffff)) goto LAB_003a8a26;
  }
  else {
LAB_003a8a26:
    pvVar11 = std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::
              operator[](local_40,1);
    iDynTree::MatrixDynSize::resize((ulong)pvVar11,sVar8 & 0xffffffff);
  }
  pMVar13 = (MatrixDynSize *)(in_RDI + 0x140);
  pvVar11 = std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::
            operator[](local_40,1);
  iDynTree::MatrixDynSize::operator=(pvVar11,pMVar13);
  local_1 = 1;
LAB_003a8a87:
  return (bool)(local_1 & 1);
}

Assistant:

bool ForwardEuler::evaluateCollocationConstraintJacobian(double time, const std::vector<VectorDynSize> &collocationPoints,
                                                                     const std::vector<VectorDynSize> &controlInputs, double dT,
                                                                     std::vector<MatrixDynSize> &stateJacobianValues,
                                                                     std::vector<MatrixDynSize> &controlJacobianValues)
            {
                if (!m_dynamicalSystem_ptr){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraint", "Dynamical system not set.");
                    return false;
                }

                if (collocationPoints.size() != 2){
                    std::ostringstream errorMsg;
                    errorMsg << "The size of the matrix containing the collocation point does not match the expected one. Input = ";
                    errorMsg << collocationPoints.size() << ", Expected = 2.";
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintJacobian", errorMsg.str().c_str());
                    return false;
                }

                if (controlInputs.size() != 2){
                    std::ostringstream errorMsg;
                    errorMsg << "The size of the matrix containing the control inputs does not match the expected one. Input = ";
                    errorMsg << controlInputs.size() << ", Expected = 2.";
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintJacobian", errorMsg.str().c_str());
                    return false;
                }

                unsigned int nx = static_cast<unsigned int>(m_dynamicalSystem_ptr->stateSpaceSize());
                unsigned int nu = static_cast<unsigned int>(m_dynamicalSystem_ptr->controlSpaceSize());

                if (stateJacobianValues.size() != 2) {
                    stateJacobianValues.resize(2);
                }

                if ((stateJacobianValues[0].rows() != nx) || (stateJacobianValues[0].cols() != nx)) {
                    stateJacobianValues[0].resize(nx,nx);
                }

                if (!((m_dynamicalSystem_ptr->setControlInput(controlInputs[0])))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintJacobian", "Error while setting the control input.");
                    return false;
                }

                if (!(m_dynamicalSystem_ptr->dynamicsStateFirstDerivative(collocationPoints[0], time, m_stateJacBuffer))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintJacobian",
                                "Error while evaluating the dynamical system jacobian.");
                    return false;
                }

                toEigen(stateJacobianValues[0]) = toEigen(m_identity) + dT*toEigen(m_stateJacBuffer);

                if ((stateJacobianValues[1].rows() != nx) || (stateJacobianValues[1].cols() != nx)) {
                    stateJacobianValues[1].resize(nx,nx);
                }

                toEigen(stateJacobianValues[1]) = -toEigen(m_identity);

                //Control Jacobians

                if (controlJacobianValues.size() != 2) {
                    controlJacobianValues.resize(2);
                }

                if ((controlJacobianValues[0].rows() != nx) || (controlJacobianValues[0].cols() != nu)) {
                    controlJacobianValues[0].resize(nx,nu);
                }

                if (!(m_dynamicalSystem_ptr->dynamicsControlFirstDerivative(collocationPoints[0], time, m_controlJacBuffer))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintJacobian",
                                "Error while evaluating the dynamical system control jacobian.");
                    return false;
                }

                toEigen(controlJacobianValues[0]) = dT*toEigen(m_controlJacBuffer);

                if ((controlJacobianValues[1].rows() != nx) || (controlJacobianValues[1].cols() != nu)) {
                    controlJacobianValues[1].resize(nx,nu);
                }

                controlJacobianValues[1] = m_zeroNxNuBuffer;

                return true;
            }